

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

bool __thiscall NJamSpell::TTokenizer::LoadAlphabet(TTokenizer *this,string *alphabetFile)

{
  long lVar1;
  bool bVar2;
  undefined1 local_b8 [8];
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  alphabet;
  string data;
  wstring wdata;
  int local_34 [2];
  wchar_t chr;
  
  LoadFile((string *)&alphabet._M_h._M_single_bucket,alphabetFile);
  if (data._M_dataplus._M_p == (pointer)0x0) {
    bVar2 = false;
  }
  else {
    UTF8ToWide((wstring *)((long)&data.field_2 + 8),(string *)&alphabet._M_h._M_single_bucket);
    if (wdata._M_dataplus._M_p == (pointer)0x0) {
      bVar2 = false;
    }
    else {
      ToLower((wstring *)((long)&data.field_2 + 8));
      local_b8 = (undefined1  [8])&alphabet._M_h._M_rehash_policy._M_next_resize;
      alphabet._M_h._M_buckets = (__buckets_ptr)0x1;
      alphabet._M_h._M_bucket_count = 0;
      alphabet._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      alphabet._M_h._M_element_count._0_4_ = 0x3f800000;
      alphabet._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      alphabet._M_h._M_rehash_policy._4_4_ = 0;
      alphabet._M_h._M_rehash_policy._M_next_resize = 0;
      for (lVar1 = 0; (long)wdata._M_dataplus._M_p << 2 != lVar1; lVar1 = lVar1 + 4) {
        local_34[0] = *(int *)(data.field_2._8_8_ + lVar1);
        if ((local_34[0] != 10) && (local_34[0] != 0xd)) {
          std::__detail::
          _Insert_base<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)local_b8,local_34);
        }
      }
      bVar2 = alphabet._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      if (bVar2) {
        std::
        _Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::operator=(&(this->Alphabet)._M_h,
                    (_Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_b8);
      }
      std::
      _Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_b8);
    }
    std::__cxx11::wstring::~wstring((wstring *)(data.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)&alphabet._M_h._M_single_bucket);
  return bVar2;
}

Assistant:

bool TTokenizer::LoadAlphabet(const std::string& alphabetFile) {
    std::string data = LoadFile(alphabetFile);
    if (data.empty()) {
        return false;
    }
    std::wstring wdata = UTF8ToWide(data);
    if (wdata.empty()) {
        return false;
    }
    ToLower(wdata);
    std::unordered_set<wchar_t> alphabet;
    for (auto chr: wdata) {
        if (chr == 10 || chr == 13) {
            continue;
        }
        alphabet.insert(chr);
    }
    if (alphabet.empty()) {
        return false;
    }
    Alphabet = alphabet;
    return true;
}